

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::
SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplaceRealloc<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           *this,pointer pos,
          span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator psVar4;
  long lVar5;
  pointer psVar6;
  pointer psVar7;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
  *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
          ::max_size((SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                      *)0x41be3b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
          ::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  psVar4 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           ::begin(in_RDI);
  lVar5 = (long)__last - (long)psVar4;
  psVar6 = (pointer)operator_new(0x41be9a);
  psVar7 = psVar6 + (lVar5 >> 4);
  psVar7->_M_ptr = (pointer)*in_RDX;
  (psVar7->_M_extent)._M_extent_value = in_RDX[1];
  psVar4 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
           ::end(in_RDI);
  if (in_RSI == psVar4) {
    __result = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
               ::begin(in_RDI);
    psVar4 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*,std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
    ::begin(in_RDI);
    std::
    uninitialized_move<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*,std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    psVar4 = SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*,std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  ::cleanup(in_RDI,(EVP_PKEY_CTX *)psVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = psVar6;
  return psVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}